

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule.hpp
# Opt level: O1

rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>
* __thiscall
boost::spirit::classic::
rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>
::operator=(rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>
            *this,sequence<_e02d66a4_> *p)

{
  pointer pcVar1;
  long *plVar2;
  ParserDPOMDPFormat_Spirit *pPVar3;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  
  puVar6 = (undefined8 *)operator_new(0x60);
  *puVar6 = &PTR__concrete_parser_005ce710;
  pPVar3 = ((SetNrStates *)
           ((long)&(p->super_binary<_d51752f6_>).subj.super_compressed_pair_imp<_366da8fd_>.first_.
                   super_binary<_da3dfda_>.subj.super_compressed_pair_imp<_5a235c92_> + 8))->_m_po;
  sVar4 = *(size_t *)
           ((long)&(p->super_binary<_d51752f6_>).subj.super_compressed_pair_imp<_366da8fd_>.first_.
                   super_binary<_da3dfda_>.subj.super_compressed_pair_imp<_5a235c92_> + 0x10);
  uVar5 = *(undefined8 *)
           ((long)&(p->super_binary<_d51752f6_>).subj.super_compressed_pair_imp<_366da8fd_>.first_.
                   super_binary<_da3dfda_>.subj.super_compressed_pair_imp<_5a235c92_> + 0x18);
  puVar6[1] = *(undefined8 *)
               &(p->super_binary<_d51752f6_>).subj.super_compressed_pair_imp<_366da8fd_>.first_.
                super_binary<_da3dfda_>.subj.super_compressed_pair_imp<_5a235c92_>;
  puVar6[2] = pPVar3;
  puVar6[3] = sVar4;
  puVar6[4] = uVar5;
  puVar6[5] = *(second_type *)
               ((long)&(p->super_binary<_d51752f6_>).subj.super_compressed_pair_imp<_366da8fd_>.
                       first_.super_binary<_da3dfda_>.subj.super_compressed_pair_imp<_5a235c92_> +
               0x20);
  puVar6[6] = (((second_type *)
               ((long)&(p->super_binary<_d51752f6_>).subj.super_compressed_pair_imp<_366da8fd_>.
                       first_.super_binary<_da3dfda_>.subj.super_compressed_pair_imp<_5a235c92_> +
               0x28))->
              super_unary<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>,_boost::spirit::classic::parser<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>,_DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::DebugOutput>_>_>
              ).subj;
  puVar6[7] = puVar6 + 9;
  pcVar1 = (((DebugOutput *)
            ((long)&(p->super_binary<_d51752f6_>).subj.super_compressed_pair_imp<_366da8fd_>.first_.
                    super_binary<_da3dfda_>.subj.super_compressed_pair_imp<_5a235c92_> + 0x30))->s).
           _M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar6 + 7),pcVar1,
             pcVar1 + *(size_type *)
                       ((long)&(p->super_binary<_d51752f6_>).subj.
                               super_compressed_pair_imp<_366da8fd_>.first_.super_binary<_da3dfda_>.
                               subj.super_compressed_pair_imp<_5a235c92_> + 0x38));
  puVar6[0xb] = (p->super_binary<_d51752f6_>).subj.super_compressed_pair_imp<_366da8fd_>.second_;
  plVar2 = *(long **)this;
  *(undefined8 **)this = puVar6;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  return (rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>
          *)this;
}

Assistant:

rule& operator=(ParserT const& p)
        {
            ptr.reset(new impl::concrete_parser<ParserT, scanner_t, attr_t>(p));
            return *this;
        }